

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O0

BasePropHandleT<OpenMesh::Attributes::StatusInfo> __thiscall
OpenMesh::PropertyContainer::add<OpenMesh::Attributes::StatusInfo>
          (PropertyContainer *this,StatusInfo *param_1,string *_name)

{
  bool bVar1;
  bool bVar2;
  reference ppBVar3;
  PropertyT<OpenMesh::Attributes::StatusInfo> *this_00;
  reference ppBVar4;
  value_type local_48;
  int local_3c;
  iterator iStack_38;
  int idx;
  iterator p_end;
  iterator p_it;
  string *_name_local;
  StatusInfo *param_1_local;
  PropertyContainer *this_local;
  
  p_end = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::begin
                    (&this->properties_);
  iStack_38 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::end
                        (&this->properties_);
  local_3c = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&p_end,&stack0xffffffffffffffc8);
    bVar2 = false;
    if (bVar1) {
      ppBVar3 = __gnu_cxx::
                __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                ::operator*(&p_end);
      bVar2 = *ppBVar3 != (BaseProperty *)0x0;
    }
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
    ::operator++(&p_end);
    local_3c = local_3c + 1;
  }
  bVar2 = __gnu_cxx::operator==(&p_end,&stack0xffffffffffffffc8);
  if (bVar2) {
    local_48 = (value_type)0x0;
    std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::push_back
              (&this->properties_,&local_48);
  }
  this_00 = (PropertyT<OpenMesh::Attributes::StatusInfo> *)operator_new(0x48);
  PropertyT<OpenMesh::Attributes::StatusInfo>::PropertyT(this_00,_name);
  ppBVar4 = std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::
            operator[](&this->properties_,(long)local_3c);
  *ppBVar4 = (value_type)this_00;
  BasePropHandleT<OpenMesh::Attributes::StatusInfo>::BasePropHandleT
            ((BasePropHandleT<OpenMesh::Attributes::StatusInfo> *)((long)&this_local + 4),local_3c);
  return (BaseHandle)(BaseHandle)this_local._4_4_;
}

Assistant:

BasePropHandleT<T> add(const T&, const std::string& _name="<unknown>")
  {
    Properties::iterator p_it=properties_.begin(), p_end=properties_.end();
    int idx=0;
    for ( ; p_it!=p_end && *p_it!=NULL; ++p_it, ++idx ) {};
    if (p_it==p_end) properties_.push_back(NULL);
    properties_[idx] = new PropertyT<T>(_name);
    return BasePropHandleT<T>(idx);
  }